

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadImage(ColladaParser *this,Image *pImage)

{
  FormatVersion FVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  undefined4 extraout_var;
  Logger *pLVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  do {
    while( true ) {
      while( true ) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar4 == '\0') {
          return;
        }
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar4 == 1) break;
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar4 == 2) {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"image");
          if (iVar4 == 0) {
            return;
          }
        }
      }
      bVar2 = IsElement(this,"image");
      if (!bVar2) break;
LAB_003ee936:
      SkipElement(this);
    }
    bVar2 = IsElement(this,"init_from");
    FVar1 = this->mFormat;
    if (bVar2) {
      if (FVar1 == FV_1_5_n) {
        uVar5 = TestAttribute(this,"array_index");
        if ((uVar5 == 0xffffffff) ||
           (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar5), iVar4 < 1
           )) {
          uVar5 = TestAttribute(this,"mip_index");
          if ((uVar5 != 0xffffffff) &&
             (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar5),
             0 < iVar4)) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Collada: Ignoring MIP map layer");
          }
        }
        else {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"Collada: Ignoring texture array index");
        }
      }
      else if (FVar1 == FV_1_4_n) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
        if ((char)iVar4 == '\0') {
          pcVar6 = TestTextContent(this);
          if (pcVar6 != (char *)0x0) {
            std::__cxx11::string::assign((char *)pImage);
          }
          TestClosing(this,"init_from");
        }
        if ((pImage->mFileName)._M_string_length == 0) {
          std::__cxx11::string::assign((char *)pImage);
        }
      }
    }
    else {
      if (FVar1 != FV_1_5_n) goto LAB_003ee936;
      bVar2 = IsElement(this,"ref");
      if (bVar2) {
        pcVar6 = TestTextContent(this);
        if (pcVar6 != (char *)0x0) {
          std::__cxx11::string::assign((char *)pImage);
        }
        TestClosing(this,"ref");
      }
      else {
        bVar2 = IsElement(this,"hex");
        if ((bVar2) && ((pImage->mFileName)._M_string_length == 0)) {
          uVar5 = TestAttribute(this,"format");
          if (uVar5 == 0xffffffff) {
            pLVar7 = DefaultLogger::get();
            Logger::warn(pLVar7,"Collada: Unknown image file format");
          }
          else {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
            std::__cxx11::string::assign((char *)&pImage->mEmbeddedFormat);
          }
          pbVar8 = (byte *)GetTextContent(this);
          uVar5 = 0;
          uVar11 = 0;
          pbVar9 = pbVar8;
          while ((0x20 < (ulong)*pbVar9 || ((0x100003601U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))) {
            pbVar9 = pbVar9 + 1;
            uVar11 = uVar11 + 2;
            uVar5 = uVar5 + 2;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&pImage->mImageData,(ulong)uVar11);
          lVar12 = 0;
          for (uVar10 = 0; (ulong)uVar5 * 2 != uVar10; uVar10 = uVar10 + 2) {
            uVar3 = HexOctetToDecimal((char *)(pbVar8 + (uVar10 & 0xffffffff)));
            (pImage->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar12] = uVar3;
            lVar12 = lVar12 + 1;
          }
          TestClosing(this,"hex");
        }
      }
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadImage(Collada::Image& pImage)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            // Need to run different code paths here, depending on the Collada XSD version
            if (IsElement("image")) {
                SkipElement();
            }
            else if (IsElement("init_from"))
            {
                if (mFormat == FV_1_4_n)
                {
                    // FIX: C4D exporter writes empty <init_from/> tags
                    if (!mReader->isEmptyElement()) {
                        // element content is filename - hopefully
                        const char* sz = TestTextContent();
                        if (sz)pImage.mFileName = sz;
                        TestClosing("init_from");
                    }
                    if (!pImage.mFileName.length()) {
                        pImage.mFileName = "unknown_texture";
                    }
                }
                else if (mFormat == FV_1_5_n)
                {
                    // make sure we skip over mip and array initializations, which
                    // we don't support, but which could confuse the loader if
                    // they're not skipped.
                    int attrib = TestAttribute("array_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring texture array index");
                        continue;
                    }

                    attrib = TestAttribute("mip_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring MIP map layer");
                        continue;
                    }

                    // TODO: correctly jump over cube and volume maps?
                }
            }
            else if (mFormat == FV_1_5_n)
            {
                if (IsElement("ref"))
                {
                    // element content is filename - hopefully
                    const char* sz = TestTextContent();
                    if (sz)pImage.mFileName = sz;
                    TestClosing("ref");
                }
                else if (IsElement("hex") && !pImage.mFileName.length())
                {
                    // embedded image. get format
                    const int attrib = TestAttribute("format");
                    if (-1 == attrib)
                        ASSIMP_LOG_WARN("Collada: Unknown image file format");
                    else pImage.mEmbeddedFormat = mReader->getAttributeValue(attrib);

                    const char* data = GetTextContent();

                    // hexadecimal-encoded binary octets. First of all, find the
                    // required buffer size to reserve enough storage.
                    const char* cur = data;
                    while (!IsSpaceOrNewLine(*cur)) cur++;

                    const unsigned int size = (unsigned int)(cur - data) * 2;
                    pImage.mImageData.resize(size);
                    for (unsigned int i = 0; i < size; ++i)
                        pImage.mImageData[i] = HexOctetToDecimal(data + (i << 1));

                    TestClosing("hex");
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "image") == 0)
                break;
        }
    }
}